

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

void swrenderer::R_HighlightPortal(PortalDrawseg *pds)

{
  short sVar1;
  short sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  BYTE *pBVar7;
  short *psVar8;
  int YbottomPrev;
  int YtopPrev;
  int Ybottom;
  int Ytop;
  int p;
  int x;
  BYTE *pixels;
  BYTE color;
  PortalDrawseg *pds_local;
  
  iVar4 = BestColor((uint32 *)&GPalette,0xff,0,0,0,0xff);
  bVar3 = (byte)iVar4;
  pBVar7 = DCanvas::GetBuffer(RenderTarget);
  for (Ytop = pds->x1; Ytop < pds->x2; Ytop = Ytop + 1) {
    if ((-1 < Ytop) && (iVar4 = DCanvas::GetWidth(RenderTarget), Ytop < iVar4)) {
      iVar4 = Ytop - pds->x1;
      psVar8 = TArray<short,_short>::operator[](&pds->ceilingclip,(long)iVar4);
      uVar5 = (uint)*psVar8;
      psVar8 = TArray<short,_short>::operator[](&pds->floorclip,(long)iVar4);
      uVar6 = (uint)*psVar8;
      if ((Ytop == pds->x1) || (Ytop == pds->x2 + -1)) {
        (*(RenderTarget->super_DObject)._vptr_DObject[0x14])
                  (RenderTarget,(ulong)(uint)Ytop,(ulong)uVar5,(ulong)(uint)Ytop,(ulong)(uVar6 + 1),
                   (ulong)bVar3,0);
      }
      else {
        psVar8 = TArray<short,_short>::operator[](&pds->ceilingclip,(long)(iVar4 + -1));
        sVar1 = *psVar8;
        psVar8 = TArray<short,_short>::operator[](&pds->floorclip,(long)(iVar4 + -1));
        sVar2 = *psVar8;
        iVar4 = uVar5 - (int)sVar1;
        if (iVar4 < 1) {
          iVar4 = -iVar4;
        }
        if (iVar4 < 2) {
          iVar4 = DCanvas::GetPitch(RenderTarget);
          pBVar7[(long)Ytop + (long)(int)(uVar5 * iVar4)] = bVar3;
        }
        else {
          (*(RenderTarget->super_DObject)._vptr_DObject[0x14])
                    (RenderTarget,(ulong)(uint)Ytop,(ulong)(uint)(int)sVar1,(ulong)(uint)Ytop,
                     (ulong)uVar5,(ulong)bVar3,0);
        }
        iVar4 = uVar6 - (int)sVar2;
        if (iVar4 < 1) {
          iVar4 = -iVar4;
        }
        if (iVar4 < 2) {
          iVar4 = DCanvas::GetPitch(RenderTarget);
          pBVar7[(long)Ytop + (long)(int)(uVar6 * iVar4)] = bVar3;
        }
        else {
          (*(RenderTarget->super_DObject)._vptr_DObject[0x14])
                    (RenderTarget,(ulong)(uint)Ytop,(ulong)(uint)(int)sVar2,(ulong)(uint)Ytop,
                     (ulong)uVar6,(ulong)bVar3,0);
        }
      }
    }
  }
  return;
}

Assistant:

void R_HighlightPortal (PortalDrawseg* pds)
{
	// [ZZ] NO OVERFLOW CHECKS HERE
	//      I believe it won't break. if it does, blame me. :(

	BYTE color = (BYTE)BestColor((DWORD *)GPalette.BaseColors, 255, 0, 0, 0, 255);

	BYTE* pixels = RenderTarget->GetBuffer();
	// top edge
	for (int x = pds->x1; x < pds->x2; x++)
	{
		if (x < 0 || x >= RenderTarget->GetWidth())
			continue;

		int p = x - pds->x1;
		int Ytop = pds->ceilingclip[p];
		int Ybottom = pds->floorclip[p];

		if (x == pds->x1 || x == pds->x2-1)
		{
			RenderTarget->DrawLine(x, Ytop, x, Ybottom+1, color, 0);
			continue;
		}

		int YtopPrev = pds->ceilingclip[p-1];
		int YbottomPrev = pds->floorclip[p-1];

		if (abs(Ytop-YtopPrev) > 1)
			RenderTarget->DrawLine(x, YtopPrev, x, Ytop, color, 0);
		else *(pixels + Ytop * RenderTarget->GetPitch() + x) = color;

		if (abs(Ybottom-YbottomPrev) > 1)
			RenderTarget->DrawLine(x, YbottomPrev, x, Ybottom, color, 0);
		else *(pixels + Ybottom * RenderTarget->GetPitch() + x) = color;
	}
}